

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status
fdb_iterator_seek_byseq
          (fdb_iterator *iterator,fdb_seqnum_t seqnum,fdb_iterator_seek_opt_t seek_pref)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  avl_node *paVar4;
  wal_item *pwVar5;
  size_t sStack_110;
  undefined1 auStack_108 [16];
  wal_item_header query_key;
  wal_item query;
  fdb_seqnum_t _seq;
  uint8_t *end_seq_kv;
  size_t size_chunk;
  size_t size_seq;
  fdb_iterator_seek_opt_t seek_pref_local;
  fdb_seqnum_t seqnum_local;
  fdb_iterator *iterator_local;
  
  if ((iterator == (fdb_iterator *)0x0) || (iterator->handle == (fdb_kvs_handle *)0x0)) {
    iterator_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if ((iterator->_key == (void *)0x0) && (seqnum != 0xffffffffffffffff)) {
    iterator->direction = '\0';
    iterator->status = '\0';
    iterator->_seqnum = seqnum;
    uVar1 = (iterator->handle->config).chunksize;
    uVar3 = (ulong)uVar1;
    lVar2 = -(uVar3 + 0x17 & 0xfffffffffffffff0);
    paVar4 = (avl_node *)(auStack_108 + lVar2);
    query.field_12.avl_flush.right =
         (avl_node *)
         (seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 | (seqnum & 0xff0000000000) >> 0x18 |
          (seqnum & 0xff00000000) >> 8 | (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 |
          (seqnum & 0xff00) << 0x28 | seqnum << 0x38);
    if (iterator->handle->kvs == (kvs_info *)0x0) {
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e410;
      btree_iterator_free(*(btree_iterator **)(auStack_108 + lVar2 + 8));
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e42c;
      btree_iterator_init(*(btree **)((long)&query_key + lVar2 + 8),
                          *(btree_iterator **)((long)&query_key + lVar2),
                          *(void **)(auStack_108 + lVar2 + 8));
    }
    else {
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e3be;
      kvid2buf(*(size_t *)((long)&query_key + lVar2 + 8),*(fdb_kvs_id_t *)((long)&query_key + lVar2)
               ,*(void **)(auStack_108 + lVar2 + 8));
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e3d3;
      memcpy((undefined1 *)((long)&paVar4->parent + uVar3),(void *)((long)&query.field_12 + 0x10),8)
      ;
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e3e0;
      hbtrie_iterator_free(*(hbtrie_iterator **)(auStack_108 + lVar2 + 8));
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e401;
      hbtrie_iterator_init
                (*(hbtrie **)((long)&query_key + lVar2),
                 *(hbtrie_iterator **)(auStack_108 + lVar2 + 8),paVar4->parent,
                 *(size_t *)((long)&sStack_110 + lVar2));
    }
    if (iterator->handle->kvs == (kvs_info *)0x0) {
      query_key.avl_key.right = (avl_node *)0x0;
      query_key.key._0_2_ = 0;
    }
    else {
      query_key.avl_key.right = paVar4;
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e461;
      kvid2buf(*(size_t *)((long)&query_key + lVar2 + 8),*(fdb_kvs_id_t *)((long)&query_key + lVar2)
               ,*(void **)(auStack_108 + lVar2 + 8));
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e476;
      memcpy((undefined1 *)((long)&paVar4->parent + uVar3),(void *)((long)&query.field_12 + 0x10),8)
      ;
      query_key.key._0_2_ = uVar1 + 8;
    }
    query.avl_seq.right = (avl_node *)(auStack_108 + 8);
    query.offset = seqnum;
    *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e4c5;
    pwVar5 = wal_itr_search_greater
                       (*(wal_iterator **)((long)&query_key + lVar2 + 0x10),
                        *(wal_item **)((long)&query_key + lVar2 + 8));
    iterator->tree_cursor = pwVar5;
    if (iterator->tree_cursor == (wal_item *)0x0) {
      iterator->_offset = 0xffffffffffffffff;
    }
    else {
      iterator->_offset = iterator->tree_cursor->offset;
    }
    iterator->tree_cursor_prev = iterator->tree_cursor;
    if (seek_pref == '\0') {
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e525;
      iterator_local._4_4_ = fdb_iterator_next((fdb_iterator *)paVar4->parent);
    }
    else {
      iterator->status = '\x01';
      *(undefined8 *)((long)&sStack_110 + lVar2) = 0x15e53b;
      iterator_local._4_4_ = fdb_iterator_prev((fdb_iterator *)paVar4->parent);
    }
  }
  else {
    iterator_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  return iterator_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_seek_byseq(fdb_iterator* iterator,
                                   const fdb_seqnum_t seqnum,
                                   const fdb_iterator_seek_opt_t seek_pref)
{
    if (!iterator || !iterator->handle) return FDB_RESULT_INVALID_HANDLE;
    if (iterator->_key || seqnum == SEQNUM_NOT_USED) return FDB_RESULT_INVALID_ARGS;

    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_seqnum = seqnum;

    size_t size_seq = sizeof(fdb_seqnum_t);
    size_t size_chunk = iterator->handle->config.chunksize;
    uint8_t *end_seq_kv = alca(uint8_t, size_chunk + size_seq);
    fdb_seqnum_t _seq = _endian_encode(seqnum);
    if (iterator->handle->kvs) {
        // create an iterator handle for hb-trie
        kvid2buf(size_chunk, iterator->handle->kvs->id, end_seq_kv);
        memcpy(end_seq_kv + size_chunk, &_seq, size_seq);

        // reset HB+trie's seqtrie iterator using end_seq_kv
        hbtrie_iterator_free(iterator->seqtrie_iterator);
        hbtrie_iterator_init(iterator->handle->seqtrie,
                             iterator->seqtrie_iterator,
                             end_seq_kv, sizeof(size_t)*2);
    } else {
        // reset Btree iterator to end_seqnum
        btree_iterator_free(iterator->seqtree_iterator);
        // create an iterator handle for b-tree
        btree_iterator_init(iterator->handle->seqtree,
                            iterator->seqtree_iterator,
                            (void *)&_seq);
    }

    struct wal_item query;
    struct wal_item_header query_key;
    if (iterator->handle->kvs) {
        query_key.key = end_seq_kv;
        kvid2buf(size_chunk, iterator->handle->kvs->id, end_seq_kv);
        memcpy(end_seq_kv + size_chunk, &_seq, size_seq);
        query_key.keylen = size_chunk + size_seq;
    } else {
        query_key.key = (void *) NULL;
        query_key.keylen = 0;
    }
    query.header = &query_key;
    query.seqnum = seqnum;

    // reset WAL tree cursor using search because of the sharded WAL
    iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr, &query);

    if (iterator->tree_cursor) {
        // If WAL tree has an entry, skip Main index for reverse iteration..
        iterator->_offset = iterator->tree_cursor->offset;
    } else {
        iterator->_offset = BLK_NOT_FOUND; // fetch from main index
    }

    iterator->tree_cursor_prev = iterator->tree_cursor;
    if (seek_pref == FDB_ITR_SEEK_HIGHER) {
        return fdb_iterator_next(iterator);
    } else {
        iterator->status = FDB_ITR_WAL;
        return fdb_iterator_prev(iterator);
    }
}